

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O2

MessageBuilder * __thiscall
doctest::detail::MessageBuilder::operator_(MessageBuilder *this,char (*in) [64])

{
  ostream *s;
  String local_30;
  
  s = this->m_stream;
  toStream<char[64]>(&local_30,in);
  doctest::operator<<(s,&local_30);
  String::~String(&local_30);
  return this;
}

Assistant:

MessageBuilder& operator,(const T& in) {
            *m_stream << (DOCTEST_STRINGIFY(in));
            return *this;
        }